

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O1

void __thiscall TSDemuxer::openFile(TSDemuxer *this,string *streamName)

{
  bool bVar1;
  int iVar2;
  undefined4 *puVar3;
  ostringstream ss;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  string local_1b0;
  string local_190 [11];
  
  std::__cxx11::string::_M_assign((string *)&this->m_streamName);
  unquoteStr(&local_1b0,streamName);
  strToLowerCase(local_190,&local_1b0);
  std::__cxx11::string::operator=((string *)&this->m_streamNameLow,(string *)local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
    operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_lastPesPts)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_lastPesDts)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_fullPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_fullDtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_firstPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_firstDtsTime)._M_t);
  this->m_firstPCRTime = -1;
  this->m_lastPCRVal = -1;
  bVar1 = isM2TSExt(streamName);
  this->m_m2tsMode = bVar1;
  iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[8])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,
                     (this->m_streamName)._M_dataplus._M_p,0,0);
  if ((char)iVar2 != '\0') {
    this->m_pmtPid = -1;
    this->m_codecReady = false;
    this->m_readCnt = 0;
    this->m_dataProcessed = 0;
    this->m_notificated = false;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t open stream ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(this->m_streamName)._M_dataplus._M_p,
             (this->m_streamName)._M_string_length);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 100;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1d0 == &local_1c0) {
    puVar3[6] = local_1c0;
    puVar3[7] = uStack_1bc;
    puVar3[8] = uStack_1b8;
    puVar3[9] = uStack_1b4;
  }
  else {
    *(uint **)(puVar3 + 2) = local_1d0;
    *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1bc,local_1c0);
  }
  *(undefined8 *)(puVar3 + 4) = local_1c8;
  local_1c0 = local_1c0 & 0xffffff00;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSDemuxer::openFile(const std::string& streamName)
{
    m_streamName = streamName;
    m_streamNameLow = strToLowerCase(unquoteStr(streamName));
    readClose();
    m_lastPesPts.clear();
    m_lastPesDts.clear();
    m_fullPtsTime.clear();
    m_fullDtsTime.clear();
    m_firstPtsTime.clear();
    m_firstDtsTime.clear();
    m_firstPCRTime = -1;
    m_lastPCRVal = -1;

    m_m2tsMode = isM2TSExt(streamName);

    if (!m_bufferedReader->openStream(m_readerID, m_streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << m_streamName)

    m_pmtPid = -1;
    m_codecReady = false;
    m_readCnt = 0;
    m_dataProcessed = 0;
    m_notificated = false;
}